

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O0

void __thiscall
QHttpNetworkRequest::setRedirectPolicy(QHttpNetworkRequest *this,RedirectPolicy policy)

{
  QHttpNetworkRequestPrivate *pQVar1;
  RedirectPolicy in_ESI;
  
  pQVar1 = QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->
                     ((QSharedDataPointer<QHttpNetworkRequestPrivate> *)CONCAT44(in_ESI,in_ESI));
  pQVar1->redirectPolicy = in_ESI;
  return;
}

Assistant:

void QHttpNetworkRequest::setRedirectPolicy(QNetworkRequest::RedirectPolicy policy)
{
    d->redirectPolicy = policy;
}